

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

word zzModW(word *a,size_t n,word w)

{
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  dword divisor;
  word r;
  undefined8 local_20;
  undefined8 local_10;
  
  local_20 = 0;
  local_10 = in_RSI;
  while (local_10 != 0) {
    local_20 = __umodti3(*(undefined8 *)(in_RDI + (local_10 + -1) * 8),local_20,in_RDX,0);
    local_10 = local_10 + -1;
  }
  return local_20;
}

Assistant:

word zzModW(const word a[], size_t n, register word w)
{
	register word r = 0;
	register dword divisor;
	ASSERT(w > 0);
	ASSERT(wwIsValid(a, n));
	while (n--)
	{
		divisor = r;
		divisor <<= B_PER_W;
		divisor |= a[n];
		r = (word)(divisor % w);
	}
	divisor = 0, w = 0;
	return r;
}